

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O2

flat_example * flatten_example(vw *all,example *ec)

{
  uint32_t *puVar1;
  wclass *pwVar2;
  wclass *pwVar3;
  uint64_t *puVar4;
  bool bVar5;
  flat_example *pfVar6;
  char *__dest;
  uint32_t *puVar7;
  ulong uVar8;
  long lVar9;
  full_features_and_source *pfVar10;
  size_t sVar11;
  features *pfVar12;
  uint32_t *puVar13;
  byte bVar14;
  full_features_and_source ffs;
  
  bVar14 = 0;
  pfVar6 = calloc_or_throw<flat_example>();
  pwVar2 = (ec->l).cs.costs._end;
  pwVar3 = (ec->l).cs.costs.end_array;
  sVar11 = (ec->l).cs.costs.erase_count;
  (pfVar6->l).multi = (ec->l).multi;
  (pfVar6->l).cs.costs._end = pwVar2;
  (pfVar6->l).cs.costs.end_array = pwVar3;
  (pfVar6->l).cs.costs.erase_count = sVar11;
  (pfVar6->l).cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
  (pfVar6->l).simple.weight = ec->weight;
  sVar11 = (long)(ec->tag)._end - (long)(ec->tag)._begin;
  pfVar6->tag_len = sVar11;
  if (sVar11 != 0) {
    __dest = calloc_or_throw<char>(sVar11 + 1);
    pfVar6->tag = __dest;
    memcpy(__dest,(ec->tag)._begin,pfVar6->tag_len);
  }
  pfVar6->example_counter = ec->example_counter;
  pfVar6->ft_offset = (ec->super_example_predict).ft_offset;
  pfVar6->num_features = ec->num_features;
  ffs.fs.space_names.end_array =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  ffs.fs.space_names.erase_count = 0;
  ffs.fs.space_names._begin =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  ffs.fs.space_names._end =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  ffs.fs.indicies.end_array = (unsigned_long *)0x0;
  ffs.fs.indicies.erase_count = 0;
  ffs.fs.indicies._begin = (unsigned_long *)0x0;
  ffs.fs.indicies._end = (unsigned_long *)0x0;
  ffs.fs.sum_feat_sq = 0.0;
  ffs.fs.values.end_array = (float *)0x0;
  ffs.fs.values.erase_count = 0;
  ffs.fs.values._begin = (float *)0x0;
  ffs.fs.values._end = (float *)0x0;
  puVar1 = &(all->weights).sparse_weights._stride_shift;
  puVar13 = &(all->weights).dense_weights._stride_shift;
  puVar7 = puVar13;
  if ((all->weights).sparse != false) {
    puVar7 = puVar1;
  }
  ffs.stride_shift = *puVar7;
  bVar5 = parameters::not_null(&all->weights);
  puVar4 = &(all->weights).dense_weights._weight_mask;
  if ((all->weights).sparse != false) {
    puVar13 = puVar1;
    puVar4 = &(all->weights).sparse_weights._weight_mask;
  }
  if (bVar5) {
    uVar8 = *puVar4;
  }
  else {
    uVar8 = 0x7fffffffffffffff;
  }
  ffs.mask = uVar8 >> ((byte)*puVar13 & 0x3f);
  GD::foreach_feature<full_features_and_source,_unsigned_long,_&vec_ffs_store>(all,ec,&ffs);
  pfVar10 = &ffs;
  pfVar12 = &pfVar6->fs;
  for (lVar9 = 100; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(undefined1 *)&(pfVar12->values)._begin = *(undefined1 *)pfVar10;
    pfVar10 = (full_features_and_source *)((long)pfVar10 + (ulong)bVar14 * -2 + 1);
    pfVar12 = (features *)((long)pfVar12 + (ulong)bVar14 * -2 + 1);
  }
  return pfVar6;
}

Assistant:

flat_example* flatten_example(vw& all, example* ec)
{
  flat_example& fec = calloc_or_throw<flat_example>();
  fec.l = ec->l;
  fec.l.simple.weight = ec->weight;

  fec.tag_len = ec->tag.size();
  if (fec.tag_len > 0)
  {
    fec.tag = calloc_or_throw<char>(fec.tag_len + 1);
    memcpy(fec.tag, ec->tag.begin(), fec.tag_len);
  }

  fec.example_counter = ec->example_counter;
  fec.ft_offset = ec->ft_offset;
  fec.num_features = ec->num_features;

  full_features_and_source ffs;
  ffs.stride_shift = all.weights.stride_shift();
  if (all.weights.not_null())  // TODO:temporary fix. all.weights is not initialized at this point in some cases.
    ffs.mask = (uint64_t)all.weights.mask() >> all.weights.stride_shift();
  else
    ffs.mask = (uint64_t)LONG_MAX >> all.weights.stride_shift();
  GD::foreach_feature<full_features_and_source, uint64_t, vec_ffs_store>(all, *ec, ffs);

  fec.fs = ffs.fs;

  return &fec;
}